

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat_solver.cpp
# Opt level: O3

bool __thiscall Satyricon::SATSolver::simplify_clause(SATSolver *this,ClausePtr c)

{
  uint uVar1;
  uint uVar2;
  literal_value lVar3;
  pointer plVar4;
  size_t new_size;
  long lVar5;
  literal_value lVar6;
  
  uVar1 = *(uint *)c;
  if (uVar1 < 2) {
    new_size = 0;
  }
  else {
    plVar4 = (this->values).
             super__Vector_base<Satyricon::literal_value,_std::allocator<Satyricon::literal_value>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar5 = 0;
    new_size = 0;
    do {
      uVar2 = *(uint *)(&c[1].field_0x0 + lVar5);
      lVar3 = plVar4[uVar2 >> 1];
      lVar6 = LIT_TRUE - lVar3;
      if ((uVar2 & 1) == 0) {
        lVar6 = lVar3;
      }
      if (lVar6 == LIT_UNASIGNED) {
        *(uint *)(&c[1].field_0x0 + new_size * 4) = uVar2;
        new_size = new_size + 1;
      }
      else if (lVar6 == LIT_TRUE) {
        return true;
      }
      lVar5 = lVar5 + 4;
    } while ((ulong)(uVar1 & 0xfffffffe) * 2 != lVar5);
  }
  Clause::shrink(c,new_size);
  return false;
}

Assistant:

bool SATSolver::simplify_clause( ClausePtr c ) {
    size_t j = 0;
    for ( const auto & l : *c ) {
        if ( get_asigned_value(l) == LIT_TRUE )
            return true; // useless
        if ( get_asigned_value(l) == LIT_UNASIGNED )
            c->at(j++) = l;
    }
    c->shrink(j);
    return false; // still usefull
}